

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

void process_pending_handles(Curl_multi *multi)

{
  undefined1 *puVar1;
  Curl_llist_element *e;
  Curl_easy *data;
  Curl_easy *pCVar2;
  
  e = (multi->pending).head;
  if (e != (Curl_llist_element *)0x0) {
    data = (Curl_easy *)e->ptr;
    data->next = (Curl_easy *)0x0;
    if (multi->easyp == (Curl_easy *)0x0) {
      data->prev = (Curl_easy *)0x0;
      multi->easyp = data;
    }
    else {
      pCVar2 = multi->easylp;
      pCVar2->next = data;
      data->prev = pCVar2;
    }
    multi->easylp = data;
    if (data->mstate != MSTATE_CONNECT) {
      data->mstate = MSTATE_CONNECT;
      Curl_init_CONNECT(data);
    }
    Curl_llist_remove(&multi->pending,e,(void *)0x0);
    Curl_expire(data,0,EXPIRE_RUN_NOW);
    puVar1 = &(data->state).field_0x74d;
    *puVar1 = *puVar1 | 0x10;
  }
  return;
}

Assistant:

static void process_pending_handles(struct Curl_multi *multi)
{
  struct Curl_llist_element *e = multi->pending.head;
  if(e) {
    struct Curl_easy *data = e->ptr;

    DEBUGASSERT(data->mstate == MSTATE_PENDING);

    /* put it back into the main list */
    link_easy(multi, data);

    multistate(data, MSTATE_CONNECT);

    /* Remove this node from the list */
    Curl_llist_remove(&multi->pending, e, NULL);

    /* Make sure that the handle will be processed soonish. */
    Curl_expire(data, 0, EXPIRE_RUN_NOW);

    /* mark this as having been in the pending queue */
    data->state.previouslypending = TRUE;
  }
}